

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O0

void __thiscall GLDrawList::MakeSortList(GLDrawList *this)

{
  uint uVar1;
  SortNode *pSVar2;
  uint local_2c;
  uint i;
  SortNode *c;
  SortNode *n;
  SortNode *p;
  GLDrawList *this_local;
  
  uVar1 = StaticSortNodeArray::Size(&SortNodes);
  this->SortNodeStart = uVar1;
  n = (SortNode *)0x0;
  c = StaticSortNodeArray::GetNew(&SortNodes);
  local_2c = 0;
  while( true ) {
    uVar1 = TArray<GLDrawItem,_GLDrawItem>::Size(&this->drawitems);
    if (uVar1 <= local_2c) break;
    c->itemindex = local_2c;
    c->right = (SortNode *)0x0;
    c->equal = (SortNode *)0x0;
    c->left = (SortNode *)0x0;
    c->parent = n;
    n = c;
    uVar1 = TArray<GLDrawItem,_GLDrawItem>::Size(&this->drawitems);
    if (local_2c == uVar1 - 1) {
      c->next = (SortNode *)0x0;
    }
    else {
      pSVar2 = StaticSortNodeArray::GetNew(&SortNodes);
      c->next = pSVar2;
      c = pSVar2;
    }
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void GLDrawList::MakeSortList()
{
	SortNode * p, * n, * c;
	unsigned i;

	SortNodeStart=SortNodes.Size();
	p=NULL;
	n=SortNodes.GetNew();
	for(i=0;i<drawitems.Size();i++)
	{
		n->itemindex=(int)i;
		n->left=n->equal=n->right=NULL;
		n->parent=p;
		p=n;
		if (i!=drawitems.Size()-1)
		{
			c=SortNodes.GetNew();
			n->next=c;
			n=c;
		}
		else
		{
			n->next=NULL;
		}
	}
}